

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale.h
# Opt level: O1

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
fmt::v5::internal::vformat<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,locale *loc,basic_string_view<wchar_t> format_str,
          basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          args)

{
  locale_ref local_828;
  undefined **local_820;
  undefined1 *local_818;
  long lStack_810;
  undefined8 local_808;
  undefined1 local_800 [2000];
  
  lStack_810 = 0;
  local_820 = &PTR_grow_001780c8;
  local_808 = 500;
  local_818 = local_800;
  locale_ref::locale_ref<std::locale>(&local_828,loc);
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_820,format_str,args,local_828);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,local_818,local_818 + lStack_810 * 4);
  local_820 = &PTR_grow_001780c8;
  if (local_818 != local_800) {
    operator_delete(local_818);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> vformat(
    const std::locale &loc, basic_string_view<Char> format_str,
    basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(loc, buffer, format_str, args);
  return fmt::to_string(buffer);
}